

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

ssize_t __thiscall kj::TestRunner::write(TestRunner *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  StringPtr *params_1;
  int __fd_00;
  char *in_stack_ffffffffffffff80;
  undefined1 local_72 [2];
  char *local_70;
  undefined8 local_68;
  StringPtr local_60;
  StringPtr message_local;
  StringPtr prefix_local;
  String text;
  
  local_70 = "";
  local_68 = 1;
  local_60.content.ptr = "";
  local_60.content.size_ = 1;
  if (this->useColor != true) goto LAB_002fc390;
  if (__fd == 2) {
    local_70 = "\x1b[0;1;34m";
LAB_002fc36d:
    local_68 = 10;
  }
  else {
    if (__fd == 1) {
      local_70 = "\x1b[0;1;32m";
      goto LAB_002fc36d;
    }
    if (__fd == 0) {
      local_70 = "\x1b[0;1;31m";
      goto LAB_002fc36d;
    }
  }
  local_60.content.ptr = "\x1b[0m";
  local_60.content.size_ = 5;
LAB_002fc390:
  local_72[1] = 0x20;
  local_72[0] = 10;
  params_1 = &local_60;
  prefix_local.content.ptr = (char *)__buf;
  prefix_local.content.size_ = __n;
  str<kj::StringPtr&,kj::StringPtr&,kj::StringPtr&,char,kj::StringPtr&,char>
            (&text,(kj *)&local_70,&prefix_local,params_1,(StringPtr *)(local_72 + 1),
             (char *)&message_local,(StringPtr *)local_72,in_stack_ffffffffffffff80);
  __fd_00 = 0x33812f;
  if (text.content.size_ != 0) {
    __fd_00 = (int)text.content.ptr;
  }
  write(this,__fd_00,(void *)(text.content.size_ + (text.content.size_ == 0)),(size_t)params_1);
  Array<char>::~Array(&text.content);
  return extraout_RAX;
}

Assistant:

void write(Color color, StringPtr prefix, StringPtr message) {
    StringPtr startColor, endColor;
    if (useColor) {
      switch (color) {
        case RED:   startColor = "\033[0;1;31m"; break;
        case GREEN: startColor = "\033[0;1;32m"; break;
        case BLUE:  startColor = "\033[0;1;34m"; break;
      }
      endColor = "\033[0m";
    }

    String text = kj::str(startColor, prefix, endColor, ' ', message, '\n');
    write(text);
  }